

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::WriteXMLResult(cmCTestLaunch *this,cmXMLElement *e2)

{
  int iVar1;
  char *local_50;
  char *local_48;
  cmsysProcess *local_40;
  cmsysProcess *cp;
  cmXMLElement e4;
  cmXMLElement local_20;
  cmXMLElement e3;
  cmXMLElement *e2_local;
  cmCTestLaunch *this_local;
  
  e3.xmlwr = (cmXMLWriter *)e2;
  cmXMLElement::Comment(e2,"Result of command");
  cmXMLElement::cmXMLElement(&local_20,(cmXMLElement *)e3.xmlwr,"Result");
  DumpFileToXML(this,&local_20,"StdOut",&this->LogOut);
  DumpFileToXML(this,&local_20,"StdErr",&this->LogErr);
  cmXMLElement::cmXMLElement((cmXMLElement *)&cp,&local_20,"ExitCondition");
  local_40 = this->Process;
  iVar1 = cmsysProcess_GetState(local_40);
  switch(iVar1) {
  case 0:
    cmXMLElement::Content<char[29]>
              ((cmXMLElement *)&cp,(char (*) [29])"No process has been executed");
    break;
  case 1:
    cmXMLElement::Content<char[37]>
              ((cmXMLElement *)&cp,(char (*) [37])"Error administrating child process: ");
    local_50 = cmsysProcess_GetErrorString(local_40);
    cmXMLElement::Content<char_const*>((cmXMLElement *)&cp,&local_50);
    break;
  case 2:
    cmXMLElement::Content<char[24]>((cmXMLElement *)&cp,(char (*) [24])"Terminated abnormally: ");
    local_48 = cmsysProcess_GetExceptionString(local_40);
    cmXMLElement::Content<char_const*>((cmXMLElement *)&cp,&local_48);
    break;
  case 3:
    cmXMLElement::Content<char[31]>
              ((cmXMLElement *)&cp,(char (*) [31])"The process is still executing");
    break;
  case 4:
    cmXMLElement::Content<int>((cmXMLElement *)&cp,&this->ExitCode);
    break;
  case 5:
    cmXMLElement::Content<char[28]>
              ((cmXMLElement *)&cp,(char (*) [28])"Killed when timeout expired");
    break;
  case 6:
    cmXMLElement::Content<char[17]>((cmXMLElement *)&cp,(char (*) [17])"Killed by parent");
    break;
  case 7:
    cmXMLElement::Content<char[9]>((cmXMLElement *)&cp,(char (*) [9])"Disowned");
  }
  cmXMLElement::~cmXMLElement((cmXMLElement *)&cp);
  cmXMLElement::~cmXMLElement(&local_20);
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLResult(cmXMLElement& e2)
{
  e2.Comment("Result of command");
  cmXMLElement e3(e2, "Result");

  // StdOut
  this->DumpFileToXML(e3, "StdOut", this->LogOut);

  // StdErr
  this->DumpFileToXML(e3, "StdErr", this->LogErr);

  // ExitCondition
  cmXMLElement e4(e3, "ExitCondition");
  cmsysProcess* cp = this->Process;
  switch (cmsysProcess_GetState(cp)) {
    case cmsysProcess_State_Starting:
      e4.Content("No process has been executed");
      break;
    case cmsysProcess_State_Executing:
      e4.Content("The process is still executing");
      break;
    case cmsysProcess_State_Disowned:
      e4.Content("Disowned");
      break;
    case cmsysProcess_State_Killed:
      e4.Content("Killed by parent");
      break;

    case cmsysProcess_State_Expired:
      e4.Content("Killed when timeout expired");
      break;
    case cmsysProcess_State_Exited:
      e4.Content(this->ExitCode);
      break;
    case cmsysProcess_State_Exception:
      e4.Content("Terminated abnormally: ");
      e4.Content(cmsysProcess_GetExceptionString(cp));
      break;
    case cmsysProcess_State_Error:
      e4.Content("Error administrating child process: ");
      e4.Content(cmsysProcess_GetErrorString(cp));
      break;
  }
}